

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni2name.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeNameTransliterator::handleTransliterate
          (UnicodeNameTransliterator *this,Replaceable *text,UTransPosition *offsets,UBool param_3)

{
  UBool UVar1;
  int32_t bufferLength;
  char *buffer;
  UnicodeString *this_00;
  __off_t __length;
  UnicodeString local_e0;
  int local_9c;
  uint local_98;
  int32_t clen;
  UChar32 c;
  int32_t len;
  UErrorCode status;
  ConstChar16Ptr local_80;
  undefined1 local_78 [8];
  UnicodeString str;
  int32_t limit;
  int32_t cursor;
  char *buf;
  int32_t maxLen;
  UBool param_3_local;
  UTransPosition *offsets_local;
  Replaceable *text_local;
  UnicodeNameTransliterator *this_local;
  
  bufferLength = uprv_getMaxCharNameLength_63();
  if (bufferLength == 0) {
    offsets->start = offsets->limit;
  }
  else {
    buffer = (char *)uprv_malloc_63((long)bufferLength);
    if (buffer == (char *)0x0) {
      offsets->start = offsets->limit;
    }
    else {
      str.fUnion._52_4_ = offsets->start;
      str.fUnion._48_4_ = offsets->limit;
      ConstChar16Ptr::ConstChar16Ptr(&local_80,L"\\N{");
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78,'\0',&local_80,3);
      ConstChar16Ptr::~ConstChar16Ptr(&local_80);
      while ((int)str.fUnion._52_4_ < (int)str.fUnion._48_4_) {
        local_98 = Replaceable::char32At(text,str.fUnion._52_4_);
        local_9c = 2 - (uint)(local_98 < 0x10000);
        c = 0;
        clen = u_charName_63(local_98,U_EXTENDED_CHAR_NAME,buffer,bufferLength,&c);
        if ((clen < 1) || (UVar1 = ::U_FAILURE(c), UVar1 != '\0')) {
          str.fUnion._52_4_ = local_9c + str.fUnion._52_4_;
        }
        else {
          icu_63::UnicodeString::truncate((UnicodeString *)local_78,(char *)0x3,__length);
          icu_63::UnicodeString::UnicodeString(&local_e0,buffer,clen,kInvariant);
          this_00 = icu_63::UnicodeString::append((UnicodeString *)local_78,&local_e0);
          icu_63::UnicodeString::append(this_00,L'}');
          icu_63::UnicodeString::~UnicodeString(&local_e0);
          (*(text->super_UObject)._vptr_UObject[4])
                    (text,(ulong)(uint)str.fUnion._52_4_,(ulong)(uint)(str.fUnion._52_4_ + local_9c)
                     ,local_78);
          clen = clen + 4;
          str.fUnion._52_4_ = clen + str.fUnion._52_4_;
          str.fUnion._48_4_ = (clen - local_9c) + str.fUnion._48_4_;
        }
      }
      offsets->contextLimit = offsets->contextLimit + (str.fUnion._48_4_ - offsets->limit);
      offsets->limit = str.fUnion._48_4_;
      offsets->start = str.fUnion._52_4_;
      uprv_free_63(buffer);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
    }
  }
  return;
}

Assistant:

void UnicodeNameTransliterator::handleTransliterate(Replaceable& text, UTransPosition& offsets,
                                                    UBool /*isIncremental*/) const {
    // The failure mode, here and below, is to behave like Any-Null,
    // if either there is no name data (max len == 0) or there is no
    // memory (malloc() => NULL).

    int32_t maxLen = uprv_getMaxCharNameLength();
    if (maxLen == 0) {
        offsets.start = offsets.limit;
        return;
    }

    // Accomodate the longest possible name plus padding
    char* buf = (char*) uprv_malloc(maxLen);
    if (buf == NULL) {
        offsets.start = offsets.limit;
        return;
    }
    
    int32_t cursor = offsets.start;
    int32_t limit = offsets.limit;

    UnicodeString str(FALSE, OPEN_DELIM, OPEN_DELIM_LEN);
    UErrorCode status;
    int32_t len;

    while (cursor < limit) {
        UChar32 c = text.char32At(cursor);
        int32_t clen = U16_LENGTH(c);
        status = U_ZERO_ERROR;
        if ((len = u_charName(c, U_EXTENDED_CHAR_NAME, buf, maxLen, &status)) >0 && !U_FAILURE(status)) {
            str.truncate(OPEN_DELIM_LEN);
            str.append(UnicodeString(buf, len, US_INV)).append(CLOSE_DELIM);
            text.handleReplaceBetween(cursor, cursor+clen, str);
            len += OPEN_DELIM_LEN + 1; // adjust for delimiters
            cursor += len; // advance cursor and adjust for new text
            limit += len-clen; // change in length
        } else {
            cursor += clen;
        }
    }

    offsets.contextLimit += limit - offsets.limit;
    offsets.limit = limit;
    offsets.start = cursor;

    uprv_free(buf);
}